

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O0

Rational * __thiscall Polynom<Rational>::valueAt(Polynom<Rational> *this,Rational *a)

{
  uint uVar1;
  uint uVar2;
  Matrix<Rational> *in_RSI;
  Rational *in_RDI;
  Rational *unaff_retaddr;
  uint i;
  Rational *res;
  Rational *in_stack_00000088;
  Rational *in_stack_00000090;
  Matrix<Rational> *in_stack_ffffffffffffff88;
  Rational *in_stack_ffffffffffffff90;
  MatrixRow<const_Rational_&> local_38 [3];
  uint local_20;
  undefined1 local_19;
  Rational *a_00;
  
  local_19 = 0;
  a_00 = in_RDI;
  Rational::Rational(in_stack_ffffffffffffff90,(longlong)in_stack_ffffffffffffff88);
  for (local_20 = 0; uVar1 = local_20, uVar2 = Matrix<Rational>::width(in_RSI), uVar1 < uVar2;
      local_20 = local_20 + 1) {
    Rational::operator*=(unaff_retaddr,a_00);
    local_38[0].arr = (Rational *)Matrix<Rational>::operator[](in_stack_ffffffffffffff88,0);
    Matrix<Rational>::MatrixRow<const_Rational_&>::operator[](local_38,local_20);
    Rational::operator+=(in_stack_00000090,in_stack_00000088);
  }
  return in_RDI;
}

Assistant:

const Field Polynom<Field>::valueAt(Field a) const
{
    Field res = 0;
    for(unsigned i = 0; i < m.width(); ++i)
    {
        res *= a;
        res += m[0][i];
    }
    return res;
}